

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_instance_array.h
# Opt level: O2

Accel * __thiscall embree::InstanceArray::getObject(InstanceArray *this,size_t i)

{
  Accel *pAVar1;
  ulong uVar2;
  
  pAVar1 = *(Accel **)&(this->super_Geometry).field_0x58;
  if (pAVar1 != (Accel *)0x0) {
    return pAVar1;
  }
  uVar2 = (ulong)*(uint *)((this->object_ids).super_RawBufferView.ptr_ofs +
                          i * (this->object_ids).super_RawBufferView.stride);
  if (uVar2 != 0xffffffff) {
    return this->objects[uVar2];
  }
  return (Accel *)0x0;
}

Assistant:

inline Accel* getObject(size_t i) const {
      if (object) {
        return object;
      }

      assert(objects);
      assert(i < numPrimitives);
      if (object_ids[i] == (unsigned int)(-1))
        return nullptr;

      assert(object_ids[i] < numObjects);
      return objects[object_ids[i]];
    }